

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_gej_verify(secp256k1_gej *a)

{
  secp256k1_fe *in_RDI;
  
  secp256k1_fe_verify(in_RDI);
  secp256k1_fe_verify(in_RDI + 1);
  secp256k1_fe_verify(in_RDI + 2);
  secp256k1_fe_verify_magnitude(in_RDI,4);
  secp256k1_fe_verify_magnitude(in_RDI + 1,4);
  secp256k1_fe_verify_magnitude(in_RDI + 2,1);
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY(&a->z);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GEJ_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GEJ_Y_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->z, SECP256K1_GEJ_Z_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}